

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_etc.c
# Opt level: O2

int zzJacobi(word *a,size_t n,word *b,size_t m,void *stack)

{
  word *b_00;
  int iVar1;
  bool_t bVar2;
  size_t m_00;
  size_t n_00;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  
  b_00 = (word *)((long)stack + n * 8);
  wwCopy(b_00,b,m);
  m_00 = wwWordSize(b_00,m);
  zzMod((word *)stack,a,n,b_00,m_00,b_00 + m);
  n_00 = wwWordSize((word *)stack,m_00);
  iVar5 = 1;
  while( true ) {
    iVar1 = wwCmpW(b_00,m_00,1);
    if (iVar1 < 1) {
      return iVar5;
    }
    bVar2 = wwIsZero((word *)stack,n_00);
    if (bVar2 != 0) break;
    bVar2 = wwIsW((word *)stack,n_00,1);
    if (bVar2 != 0) {
      return iVar5;
    }
    sVar3 = wwLoZeroBits((word *)stack,n_00);
    if (((sVar3 & 1) != 0) && ((uVar4 = (uint)*b_00 & 7, uVar4 == 5 || (uVar4 == 3)))) {
      iVar5 = -iVar5;
    }
    wwShLo((word *)stack,n_00,sVar3);
    sVar3 = wwWordSize((word *)stack,n_00);
    if (((~*stack & 3) == 0) && ((~(uint)*b_00 & 3) == 0)) {
      iVar5 = -iVar5;
    }
    zzMod(b_00,b_00,m_00,(word *)stack,sVar3,b_00 + m);
    n_00 = wwWordSize(b_00,sVar3);
    wwSwap((word *)stack,b_00,sVar3);
    m_00 = sVar3;
  }
  return 0;
}

Assistant:

int zzJacobi(const word a[], size_t n, const word b[], size_t m, void* stack)
{
	register int t = 1;
	register size_t s;
	// переменные в stack
	word* u = (word*)stack;
	word* v = u + n;
	stack = v + m;
	// pre
	ASSERT(wwIsValid(a, n));
	ASSERT(zzIsOdd(b, m));
	// v <- b
	wwCopy(v, b, m);
	m = wwWordSize(v, m);
	// u <- a \mod b
	zzMod(u, a, n, v, m, stack);
	n = wwWordSize(u, m);
	// основной цикл
	while (wwCmpW(v, m, 1) > 0)
	{
		// u == 0 => (u / v) <- 0
		if (wwIsZero(u, n))
		{
			t = 0;
			break;
		}
		// u == 1 => (u / v) <- s
		if (wwIsW(u, n, 1))
			break;
		// s <- max_{2^i | u}i
		s = wwLoZeroBits(u, n);
		// s -- нечетное, v \equiv 3, 5 \mod 8 => t <- -t
		if (s % 2 && ((v[0] & 7) == 3 || (v[0] & 7) == 5))
			t = -t;
		// u <- u / 2^s
		wwShLo(u, n, s);
		n = wwWordSize(u, n);
		// u, v \equiv 3 \mod 4 => t <- -t
		if ((u[0] & 3) == 3 && (v[0] & 3) == 3)
			t = -t;
		// v <- v \mod u
		zzMod(v, v, m, u, n, stack);
		m = wwWordSize(v, n);
		// v <-> u
		wwSwap(u, v, n);
		s = m, m = n, n = s;
	}
	// символ Якоби
	return t;
}